

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

int cvLsBandDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1,
                 N_Vector tmp2)

{
  long *plVar1;
  double dVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  sunindextype sVar6;
  sunindextype sVar7;
  int iVar8;
  realtype *prVar9;
  realtype *prVar10;
  realtype *prVar11;
  realtype *prVar12;
  realtype *prVar13;
  realtype *prVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  realtype rVar26;
  double dVar27;
  double dVar28;
  double local_c8;
  realtype *local_b8;
  double local_b0;
  
  pvVar3 = cv_mem->cv_lmem;
  uVar5 = SUNBandMatrix_Columns(Jac);
  sVar6 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar7 = SUNBandMatrix_LowerBandwidth(Jac);
  prVar9 = N_VGetArrayPointer(cv_mem->cv_ewt);
  prVar10 = N_VGetArrayPointer(fy);
  prVar11 = N_VGetArrayPointer(tmp1);
  prVar12 = N_VGetArrayPointer(y);
  prVar13 = N_VGetArrayPointer(tmp2);
  if (cv_mem->cv_constraintsSet == 0) {
    local_b8 = (realtype *)0x0;
  }
  else {
    local_b8 = N_VGetArrayPointer(cv_mem->cv_constraints);
  }
  local_b0 = 1.0;
  N_VScale(1.0,y,tmp2);
  dVar27 = cv_mem->cv_uround;
  local_c8 = 0.0;
  if (0.0 < dVar27) {
    if (dVar27 < 0.0) {
      local_c8 = sqrt(dVar27);
    }
    else {
      local_c8 = SQRT(dVar27);
    }
  }
  rVar26 = N_VWrmsNorm(fy,cv_mem->cv_ewt);
  if ((rVar26 != 0.0) || (NAN(rVar26))) {
    local_b0 = rVar26 * (double)(int)uVar5 * ABS(cv_mem->cv_h) * 1000.0 * cv_mem->cv_uround;
  }
  uVar18 = sVar6 + sVar7 + 1;
  uVar4 = uVar5;
  if ((int)uVar18 < (int)uVar5) {
    uVar4 = uVar18;
  }
  if (0 < (int)uVar4) {
    lVar20 = (long)(int)uVar18;
    uVar23 = -sVar6;
    lVar22 = 0;
    uVar17 = 0;
    do {
      iVar8 = cv_mem->cv_constraintsSet;
      uVar16 = uVar17;
      do {
        dVar27 = ABS(prVar12[uVar16]) * local_c8;
        if (ABS(prVar12[uVar16]) * local_c8 <= local_b0 / prVar9[uVar16]) {
          dVar27 = local_b0 / prVar9[uVar16];
        }
        if (iVar8 != 0) {
          dVar2 = local_b8[uVar16];
          dVar28 = ABS(dVar2);
          if ((dVar28 != 1.0) || (NAN(dVar28))) {
            if ((dVar28 == 2.0) && ((!NAN(dVar28) && (dVar2 * (prVar13[uVar16] + dVar27) <= 0.0))))
            goto LAB_004fe27c;
          }
          else if (dVar2 * (prVar13[uVar16] + dVar27) < 0.0) {
LAB_004fe27c:
            dVar27 = -dVar27;
          }
        }
        prVar13[uVar16] = dVar27 + prVar13[uVar16];
        uVar16 = uVar16 + lVar20;
      } while ((long)uVar16 < (long)(int)uVar5);
      iVar8 = (*cv_mem->cv_f)(cv_mem->cv_tn,tmp2,tmp1,cv_mem->cv_user_data);
      plVar1 = (long *)((long)pvVar3 + 0x90);
      *plVar1 = *plVar1 + 1;
      lVar21 = lVar22;
      uVar16 = uVar17;
      uVar24 = uVar23;
      if (iVar8 != 0) {
        return iVar8;
      }
      do {
        uVar25 = 0;
        if (0 < (int)uVar24) {
          uVar25 = (ulong)uVar24;
        }
        prVar13[uVar16] = prVar12[uVar16];
        iVar8 = (int)uVar16;
        prVar14 = SUNBandMatrix_Column(Jac,iVar8);
        dVar27 = ABS(prVar12[uVar16]) * local_c8;
        if (ABS(prVar12[uVar16]) * local_c8 <= local_b0 / prVar9[uVar16]) {
          dVar27 = local_b0 / prVar9[uVar16];
        }
        if (cv_mem->cv_constraintsSet != 0) {
          dVar2 = local_b8[uVar16];
          dVar28 = ABS(dVar2);
          if ((dVar28 != 1.0) || (NAN(dVar28))) {
            if ((dVar28 == 2.0) && ((!NAN(dVar28) && (dVar2 * (prVar13[uVar16] + dVar27) <= 0.0))))
            goto LAB_004fe3dd;
          }
          else if (dVar2 * (prVar13[uVar16] + dVar27) < 0.0) {
LAB_004fe3dd:
            dVar27 = -dVar27;
          }
        }
        iVar19 = iVar8 - sVar6;
        if (iVar19 < 1) {
          iVar19 = 0;
        }
        uVar15 = sVar7 + iVar8;
        if ((int)(uVar5 - 1) <= sVar7 + iVar8) {
          uVar15 = uVar5 - 1;
        }
        if (iVar19 <= (int)uVar15) {
          uVar25 = uVar25 - 1;
          do {
            *(double *)((long)prVar14 + uVar25 * 8 + lVar21 + 8) =
                 (prVar11[uVar25 + 1] - prVar10[uVar25 + 1]) * (1.0 / dVar27);
            uVar25 = uVar25 + 1;
          } while (uVar25 < uVar15);
        }
        uVar16 = uVar16 + lVar20;
        lVar21 = lVar21 + lVar20 * -8;
        uVar24 = uVar24 + uVar18;
      } while ((long)uVar16 < (long)(int)uVar5);
      uVar17 = uVar17 + 1;
      uVar23 = uVar23 + 1;
      lVar22 = lVar22 + -8;
    } while (uVar17 != uVar4);
  }
  return 0;
}

Assistant:

int cvLsBandDQJac(realtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                  CVodeMem cv_mem, N_Vector tmp1, N_Vector tmp2)
{
  N_Vector ftemp, ytemp;
  realtype fnorm, minInc, inc, inc_inv, srur, conj;
  realtype *col_j, *ewt_data, *fy_data, *ftemp_data;
  realtype *y_data, *ytemp_data, *cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem) cv_mem->cv_lmem;

  /* access matrix dimensions */
  N = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(cv_mem->cv_ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  if (cv_mem->cv_constraintsSet)
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(cv_mem->cv_uround);
  fnorm = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) * cv_mem->cv_uround * N * fnorm) : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group=1; group <= ngroups; group++) {

    /* Increment all y_j in group */
    for(j=group-1; j < N; j+=width) {
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (cv_mem->cv_constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = cv_mem->cv_f(cv_mem->cv_tn, ytemp, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) break;

    /* Restore ytemp, then form and load difference quotients */
    for (j=group-1; j < N; j+=width) {
      ytemp_data[j] = y_data[j];
      col_j = SUNBandMatrix_Column(Jac, j);
      inc = SUNMAX(srur*SUNRabs(y_data[j]), minInc/ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (cv_mem->cv_constraintsSet) {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)      {if ((ytemp_data[j]+inc)*conj < ZERO)  inc = -inc;}
        else if (SUNRabs(conj) == TWO) {if ((ytemp_data[j]+inc)*conj <= ZERO) inc = -inc;}
      }

      inc_inv = ONE/inc;
      i1 = SUNMAX(0, j-mupper);
      i2 = SUNMIN(j+mlower, N-1);
      for (i=i1; i <= i2; i++)
        SM_COLUMN_ELEMENT_B(col_j,i,j) = inc_inv * (ftemp_data[i] - fy_data[i]);
    }
  }

  return(retval);
}